

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_symbolValueBinding_createWithFlags
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t name,
          sysbvm_tuple_t value,_Bool isMutable,_Bool isExternal,_Bool isThreadLocal)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).symbolValueBindingType,0xb);
  (psVar1->field_1).pointers[0] = name;
  psVar1[1].field_1.pointers[0] = sourcePosition;
  sVar2 = sysbvm_tuple_getType(context,value);
  psVar1[2].header.field_0.typePointer = sVar2;
  psVar1[2].header.identityHashAndFlags = (int)value;
  psVar1[2].header.objectSize = (int)(value >> 0x20);
  psVar1[2].field_1.pointers[0] = (ulong)(uint)(CONCAT31(in_register_00000081,isMutable) << 4) | 0xf
  ;
  psVar1[3].header.field_0.typePointer =
       (ulong)(uint)(CONCAT31(in_register_00000089,isExternal) << 4) | 0xf;
  uVar3 = (ulong)isThreadLocal << 4 | 0xf;
  psVar1[3].header.identityHashAndFlags = (int)uVar3;
  psVar1[3].header.objectSize = (int)(uVar3 >> 0x20);
  psVar1[4].header.field_0.typePointer = 0xb;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbolValueBinding_createWithFlags(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t name, sysbvm_tuple_t value, bool isMutable, bool isExternal, bool isThreadLocal)
{
    sysbvm_symbolValueBinding_t *result = (sysbvm_symbolValueBinding_t*)sysbvm_context_allocatePointerTuple(context, context->roots.symbolValueBindingType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_symbolValueBinding_t));
    result->super.super.name = name;
    result->super.sourcePosition = sourcePosition;
    result->super.type = sysbvm_tuple_getType(context, value);
    result->value = value;
    result->isMutable = sysbvm_tuple_boolean_encode(isMutable);
    result->isExternal = sysbvm_tuple_boolean_encode(isExternal);
    result->isThreadLocal = sysbvm_tuple_boolean_encode(isThreadLocal);
    result->virtualAddress = sysbvm_tuple_uintptr_encode(context, 0);
    return (sysbvm_tuple_t)result;
}